

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O1

bool __thiscall
Sudoku::fieldCheck(Sudoku *this,
                  list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *furtherWays_,
                  FieldVector *testFields,bool recordFullFurtherWays,bool debug)

{
  int *piVar1;
  pointer psVar2;
  _List_node_base *p_Var3;
  Field *this_00;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  ulong uVar9;
  pointer psVar10;
  pointer psVar11;
  string local_68;
  pointer local_48;
  list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *local_40;
  ulong local_38;
  
  psVar2 = (testFields->
           super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  psVar10 = (testFields->
            super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (psVar2 == psVar10) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    local_48 = psVar10;
    local_40 = furtherWays_;
    do {
      psVar11 = psVar2 + 1;
      iVar4 = Field::value((psVar2->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      if ((iVar4 == 0) &&
         (iVar4 = Field::n_possible((psVar2->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>).
                                    _M_ptr), iVar4 == 1)) {
        local_38 = uVar9;
        if (debug) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  Field check: field (",0x16);
          Field::pos_abi_cxx11_
                    (&local_68,
                     (psVar2->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,
                              (char *)CONCAT44(local_68._M_dataplus._M_p._4_4_,
                                               (int)local_68._M_dataplus._M_p),
                              CONCAT44(local_68._M_string_length._4_4_,
                                       (int)local_68._M_string_length));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") must be ",10);
          iVar4 = Field::onePossibleValue
                            ((psVar2->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
          ;
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"",0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_68._M_dataplus._M_p._4_4_,(int)local_68._M_dataplus._M_p) !=
              &local_68.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_68._M_dataplus._M_p._4_4_,(int)local_68._M_dataplus._M_p)
                           );
          }
        }
        p_Var3 = (local_40->
                 super__List_base<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_>).
                 _M_impl._M_node.super__List_node_base._M_prev;
        piVar1 = (int *)((long)&p_Var3[1]._M_prev + 4);
        *piVar1 = *piVar1 + 1;
        iVar4 = Field::id((psVar2->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
        iVar5 = Field::pos_x((psVar2->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ;
        iVar6 = Field::pos_y((psVar2->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ;
        iVar7 = Field::pos_z((psVar2->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ;
        local_68.field_2._M_allocated_capacity._0_4_ =
             Field::onePossibleValue
                       ((psVar2->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
        local_68.field_2._M_allocated_capacity._4_4_ = 0;
        local_68._M_dataplus._M_p._0_4_ = iVar4;
        local_68._M_dataplus._M_p._4_4_ = iVar5;
        local_68._M_string_length._0_4_ = iVar6;
        local_68._M_string_length._4_4_ = iVar7;
        std::
        _Rb_tree<Sudoku::FurtherWays::Way,Sudoku::FurtherWays::Way,std::_Identity<Sudoku::FurtherWays::Way>,std::less<Sudoku::FurtherWays::Way>,std::allocator<Sudoku::FurtherWays::Way>>
        ::_M_insert_unique<Sudoku::FurtherWays::Way_const&>
                  ((_Rb_tree<Sudoku::FurtherWays::Way,Sudoku::FurtherWays::Way,std::_Identity<Sudoku::FurtherWays::Way>,std::less<Sudoku::FurtherWays::Way>,std::allocator<Sudoku::FurtherWays::Way>>
                    *)&p_Var3[2]._M_prev,(Way *)&local_68);
        psVar10 = local_48;
        uVar9 = local_38;
        if (!recordFullFurtherWays) {
          this_00 = (psVar2->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          iVar4 = Field::onePossibleValue(this_00);
          Field::setValue(this_00,iVar4);
          uVar9 = CONCAT71((int7)((ulong)this_00 >> 8),1);
        }
      }
    } while (((uVar9 & 1) == 0) && (psVar2 = psVar11, psVar11 != psVar10));
  }
  return (bool)((byte)uVar9 & 1);
}

Assistant:

bool Sudoku::fieldCheck(std::list<FurtherWays> &furtherWays_, FieldVector &testFields, bool recordFullFurtherWays, bool debug)
{
  bool restart = false;

  // check if there are fields that can have only one possible value
  restart = false;

  // loop over fields
  for(auto &testField : testFields)
  {
    if(testField->value() == 0)   // if value is not yet set
    {
      if(testField->n_possible() == 1)    // if there is exactly one possiblility
      {
        if(debug)
          std::cout<<"  Field check: field ("<<testField->pos()<<") must be "<<testField->onePossibleValue()<<""<<std::endl;

        furtherWays_.back().nFieldCheckMatches++;
        furtherWays_.back().addWay(testField->id(), testField->pos_x(), testField->pos_y(), testField->pos_z(),
          testField->onePossibleValue(), FurtherWays::Reason::onlyPossibilityInField);

        if(!recordFullFurtherWays)
        {
          testField->setValue(testField->onePossibleValue());
          restart = true;
          break;
        }
      }
    }
    if(restart)
      break;
  }
  return restart;
}